

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-rcnb-cli.cc
# Opt level: O2

void usage(void)

{
  std::operator<<((ostream *)&std::cerr,
                  "rcnb: Encodes and Decodes files using rcnb\nUsage: rcnb [-e|-d] [input] [output]\n   Where [-e] will encode the input file into the output file,\n         [-d] will decode the input file into the output file, and\n         [input] and [output] are the input and output files, respectively.\n"
                 );
  return;
}

Assistant:

void usage()
{
    std::cerr << \
		"rcnb: Encodes and Decodes files using rcnb\n" \
		"Usage: rcnb [-e|-d] [input] [output]\n" \
		"   Where [-e] will encode the input file into the output file,\n" \
		"         [-d] will decode the input file into the output file, and\n" \
		"         [input] and [output] are the input and output files, respectively.\n";
}